

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testparser.c
# Opt level: O0

xmlParserErrors
rot13ConvImpl(void *vctxt,char *name,xmlCharEncFlags flags,xmlCharEncodingHandler **out)

{
  int iVar1;
  undefined4 *puVar2;
  int *inputCtxt;
  xmlCharEncodingHandler **out_local;
  xmlCharEncFlags flags_local;
  char *name_local;
  void *vctxt_local;
  
  iVar1 = strcmp(name,"rot13");
  if (iVar1 == 0) {
    if ((flags & XML_ENC_OUTPUT) == 0) {
      puVar2 = (undefined4 *)(*_xmlMalloc)(4);
      *puVar2 = 0xd;
      vctxt_local._4_4_ =
           xmlCharEncNewCustomHandler(name,rot13Convert,0,rot13ConvCtxtDtor,puVar2,0,out);
    }
    else {
      vctxt_local._4_4_ = XML_ERR_UNSUPPORTED_ENCODING;
    }
  }
  else {
    vctxt_local._4_4_ = xmlCreateCharEncodingHandler(name,flags,0,0,out);
  }
  return vctxt_local._4_4_;
}

Assistant:

static xmlParserErrors
rot13ConvImpl(void *vctxt ATTRIBUTE_UNUSED, const char *name,
              xmlCharEncFlags flags, xmlCharEncodingHandler **out) {
    int *inputCtxt;

    if (strcmp(name, "rot13") != 0)
        return xmlCreateCharEncodingHandler(name, flags, NULL, NULL, out);

    if (flags & XML_ENC_OUTPUT)
        return XML_ERR_UNSUPPORTED_ENCODING;

    inputCtxt = xmlMalloc(sizeof(*inputCtxt));
    *inputCtxt = 13;

    return xmlCharEncNewCustomHandler(name, rot13Convert, NULL,
                                      rot13ConvCtxtDtor, inputCtxt, NULL,
                                      out);
}